

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall libserver::server::handle_client(server *this)

{
  time_duration_type tVar1;
  ptime *rhs;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_10;
  
  _read_from_socket(this);
  _process_request_(this);
  local_10.time_.time_count_.value_ =
       (time_rep_type)
       boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                 (boost::date_time::c_time::localtime);
  rhs = &this->_ping;
  tVar1 = boost::date_time::
          counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
          ::subtract_times(&local_10.time_,(time_rep_type *)rhs);
  if (0x4c4f27 <
      (long)tVar1.
            super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
            .ticks_.value_) {
    boost::asio::
    basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::close(&(this->socket).
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ,(int)rhs);
  }
  return;
}

Assistant:

void libserver::server::handle_client()
{
    /* 
        Main sequential client handler
        Reads from socket
        Processes the message read
    */
    // TODO: Handle errors in reading
    _read_from_socket();
    _process_request_();
    if (_is_timed_out())
    {
        _exit();
    }
}